

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

void __thiscall
timertt::details::
timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::deactivate(timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
             *this,timer_object_holder<timertt::thread_safety::safe> *timer)

{
  reference_counter_type *prVar1;
  size_t *psVar2;
  timer_type *timer_00;
  
  timer_00 = timer_object_holder<timertt::thread_safety::safe>::
             cast_to<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type>
                       (timer);
  if (timer_00->m_position != 0) {
    if (timer_00 == this->m_timer_in_processing) {
      timer_00->m_position = 0;
    }
    else {
      heap_remove(this,timer_00);
      psVar2 = &(this->
                super_engine_common<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                ).m_timer_quantities.m_single_shot_count + ((timer_00->m_period).__r != 0);
      *psVar2 = *psVar2 - 1;
      timer_00->m_position = 0;
      LOCK();
      prVar1 = &(timer_00->super_timer_object<timertt::thread_safety::safe>).m_references;
      (prVar1->super___atomic_base<unsigned_int>)._M_i =
           (prVar1->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((prVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
        (*(timer_00->super_timer_object<timertt::thread_safety::safe>)._vptr_timer_object[1])
                  (timer_00);
        return;
      }
    }
  }
  return;
}

Assistant:

void
	deactivate(
		//! Timer to be deactivated.
		timer_object_holder< THREAD_SAFETY > timer )
	{
		auto heap_timer = timer.template cast_to< timer_type >();
		if( !heap_timer->deactivated() )
		{
			// If this timer is not in processing now it can
			// be safely destroyed.
			if( heap_timer != m_timer_in_processing )
			{
				heap_remove( heap_timer );

				// Count of timers changed.
				this->dec_timer_count( heap_timer->kind() );

				// We can deactivate timer only after removing.
				// Because deactivation drops actual timer position.
				heap_timer->deactivate();

				// Release timer object.
				timer_object< THREAD_SAFETY >::decrement_references( heap_timer );
			}
			else
			{
				// Otherwise m_timer_in_processing will be destroyed
				// after end of timer action processing.
				// But it must be deactivated right now.
				heap_timer->deactivate();
			}
		}
	}